

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLQuaternion.cpp
# Opt level: O2

Quaternion *
AML::integrateQuat(Quaternion *__return_storage_ptr__,Quaternion *quat,Quaternion *quatRates,
                  double dt)

{
  anon_union_32_2_4720223f_for_Quaternion_0 local_28;
  
  local_28.data[0] = (quatRates->field_0).data[0] * dt;
  local_28.data[1] = (quatRates->field_0).data[1] * dt;
  local_28.data[2] = (quatRates->field_0).data[2] * dt;
  local_28.data[3] = (quatRates->field_0).data[3] * dt;
  operator+(quat,(Quaternion *)&local_28.field_1);
  normalise(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Quaternion integrateQuat(const Quaternion& quat, const Quaternion& quatRates, double dt)
    {
        Quaternion quatNew = quat + quatRates * dt; // First Order Euler Integration
        normalise(quatNew);                         // Normalisation
        return quatNew;
    }